

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::LossParameter::InternalSerializeWithCachedSizesToArray
          (LossParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  bool value;
  int32 value_00;
  LossParameter_NormalizationMode value_01;
  UnknownFieldSet *unknown_fields;
  uint8 *puStack_40;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  LossParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  puStack_40 = target;
  if ((uVar1 & 1) != 0) {
    value_00 = ignore_label(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1,value_00,target);
  }
  if ((uVar1 & 2) != 0) {
    value = normalize(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteBoolToArray(2,value,puStack_40);
  }
  if ((uVar1 & 4) != 0) {
    value_01 = normalization(this);
    puStack_40 = google::protobuf::internal::WireFormatLite::WriteEnumToArray(3,value_01,puStack_40)
    ;
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = LossParameter::unknown_fields(this);
    puStack_40 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                           (unknown_fields,puStack_40);
  }
  return puStack_40;
}

Assistant:

::google::protobuf::uint8* LossParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.LossParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 ignore_label = 1;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1, this->ignore_label(), target);
  }

  // optional bool normalize = 2;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->normalize(), target);
  }

  // optional .caffe.LossParameter.NormalizationMode normalization = 3 [default = VALID];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      3, this->normalization(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.LossParameter)
  return target;
}